

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_utils.cpp
# Opt level: O2

void CS248::checkGLError(string *str,bool abort_program_if_error)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  byte bVar4;
  
  bVar4 = 0;
  while( true ) {
    iVar1 = glGetError();
    if (iVar1 == 0) break;
    poVar2 = std::operator<<((ostream *)&std::cerr,"*** GL error:");
    poVar2 = std::operator<<(poVar2,(string *)str);
    poVar2 = std::operator<<(poVar2," : ");
    pcVar3 = (char *)gluErrorString(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar4 = 1;
  }
  if ((bVar4 & abort_program_if_error) != 1) {
    return;
  }
  exit(1);
}

Assistant:

void checkGLError(const std::string& str, bool abort_program_if_error) {
  GLenum err;
  bool has_error = false;
  do {
    err = glGetError();
    if (err != GL_NO_ERROR) {
       cerr << "*** GL error:" << str << " : " << gluErrorString(err) << endl;
       has_error = true;
	  }
  } while (err != GL_NO_ERROR);
  if (has_error && abort_program_if_error) {
    exit(1);
  }
}